

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::generalizedBiasForces
          (KinDynComputations *this,FreeFloatingGeneralizedTorques *generalizedBiasForces)

{
  long lVar1;
  Transform *inertial_X_link;
  SpatialAcc *this_00;
  SpatialVector<iDynTree::SpatialMotionVector> *this_01;
  JointPosDoubleArray *pJVar2;
  long lVar3;
  Wrench *pWVar4;
  FreeFloatingGeneralizedTorques *in_RSI;
  long in_RDI;
  Vector6 zeroBaseAcc;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffdf8;
  KinDynComputations *in_stack_fffffffffffffe00;
  VectorFixSize<6U> *in_stack_fffffffffffffe18;
  KinDynComputationsPrivateAttributes *this_02;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe20;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_fffffffffffffe78;
  SpatialMotionVector *in_stack_fffffffffffffe80;
  Wrench local_178;
  Transform *in_stack_fffffffffffffed0;
  Vector6 *in_stack_fffffffffffffed8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_110 [40];
  SpatialAcc local_e8;
  SpatialAcc local_b8;
  Rotation *in_stack_ffffffffffffff88;
  Twist *in_stack_ffffffffffffff90;
  Vector6 *in_stack_ffffffffffffff98;
  VectorFixSize<6U> local_40;
  FreeFloatingGeneralizedTorques *local_10;
  
  local_10 = in_RSI;
  computeFwdKinematics(in_stack_fffffffffffffe00);
  iDynTree::LinkWrenches::zero();
  VectorFixSize<6U>::VectorFixSize(&local_40);
  VectorFixSize<6U>::zero(&local_40);
  if (*(int *)(*(long *)(in_RDI + 8) + 4) == 1) {
    toEigen<6U>(in_stack_fffffffffffffe18);
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffffe00,
               (EigenBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffdf8);
    fromEigen(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  else if (*(int *)(*(long *)(in_RDI + 8) + 4) == 0) {
    iDynTree::FreeFloatingPos::worldBasePos();
    convertInertialAccelerationToBodyFixedAcceleration
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    iDynTree::SpatialAcc::operator=((SpatialAcc *)(*(long *)(in_RDI + 8) + 0x520),&local_b8);
  }
  else {
    iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::getRotation();
    convertMixedAccelerationToBodyFixedAcceleration
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iDynTree::SpatialAcc::operator=((SpatialAcc *)(*(long *)(in_RDI + 8) + 0x520),&local_e8);
  }
  inertial_X_link = (Transform *)(*(long *)(in_RDI + 8) + 0x520);
  this_00 = (SpatialAcc *)iDynTree::FreeFloatingAcc::baseAcc();
  iDynTree::SpatialAcc::operator=(this_00,(SpatialAcc *)inertial_X_link);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialMotionVector> *)(*(long *)(in_RDI + 8) + 0x520));
  pWVar4 = (Wrench *)&stack0xfffffffffffffee0;
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffe18);
  this_02 = (KinDynComputationsPrivateAttributes *)&stack0xfffffffffffffed0;
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
            (local_110,in_stack_fffffffffffffe20);
  this_01 = (SpatialVector<iDynTree::SpatialMotionVector> *)iDynTree::FreeFloatingAcc::baseAcc();
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this_01);
  toEigen<3U>((VectorFixSize<3U> *)this_02);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  iDynTree::FreeFloatingAcc::jointAcc();
  iDynTree::VectorDynSize::zero();
  lVar1 = *(long *)(in_RDI + 8);
  iDynTree::ForwardAccKinematics
            ((Model *)(lVar1 + 8),(Traversal *)(lVar1 + 0x138),(FreeFloatingPos *)(lVar1 + 0x1b0),
             (FreeFloatingVel *)(lVar1 + 0x238),(FreeFloatingAcc *)(lVar1 + 0x550),
             (LinkVelArray *)(lVar1 + 0x310),(LinkAccArray *)(lVar1 + 0x5a8));
  lVar1 = *(long *)(in_RDI + 8);
  pJVar2 = (JointPosDoubleArray *)iDynTree::FreeFloatingPos::jointPos();
  lVar3 = *(long *)(in_RDI + 8);
  iDynTree::RNEADynamicPhase
            ((Model *)(lVar1 + 8),(Traversal *)(lVar1 + 0x138),pJVar2,
             (LinkVelArray *)(lVar3 + 0x310),(LinkAccArray *)(lVar3 + 0x5a8),
             (LinkWrenches *)(lVar3 + 0x5c0),(LinkWrenches *)(lVar3 + 0x5d8),local_10);
  iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  lVar1 = *(long *)(in_RDI + 8);
  iDynTree::Traversal::getBaseLink();
  lVar3 = iDynTree::Link::getIndex();
  iDynTree::LinkPositions::operator()((LinkPositions *)(lVar1 + 0x2f8),lVar3);
  KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation
            (this_02,pWVar4,inertial_X_link);
  pWVar4 = (Wrench *)iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
  iDynTree::Wrench::operator=(pWVar4,&local_178);
  Wrench::~Wrench((Wrench *)0x1d13b2);
  return true;
}

Assistant:

bool KinDynComputations::generalizedBiasForces(FreeFloatingGeneralizedTorques & generalizedBiasForces)
{
    // Needed for using pimpl->m_linkVel
    this->computeFwdKinematics();

    // The external wrenches need to be set to zero
    pimpl->m_invDynNetExtWrenches.zero();

    // The base acceleration is "zero" in the chosen representation,
    // but the "zero" in mixed means non-zero in body-fixed, and we should account for that
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_invDynBaseAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_invDynBaseAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc,pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_invDynBaseAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                                 pimpl->m_vel.baseVel(),
                                                                                 pimpl->m_pos.worldBasePos().getRotation());
    }

    pimpl->m_invDynGeneralizedProperAccs.baseAcc() = pimpl->m_invDynBaseAcc;
    toEigen(pimpl->m_invDynGeneralizedProperAccs.baseAcc().getLinearVec3()) =
            toEigen(pimpl->m_invDynBaseAcc.getLinearVec3()) - toEigen(pimpl->m_gravityAccInBaseLinkFrame);
    pimpl->m_invDynGeneralizedProperAccs.jointAcc().zero();

    // Run inverse dynamics
    ForwardAccKinematics(pimpl->m_robot_model,
                         pimpl->m_traversal,
                         pimpl->m_pos,
                         pimpl->m_vel,
                         pimpl->m_invDynGeneralizedProperAccs,
                         pimpl->m_linkVel,
                         pimpl->m_invDynLinkProperAccs);

    RNEADynamicPhase(pimpl->m_robot_model,
                     pimpl->m_traversal,
                     pimpl->m_pos.jointPos(),
                     pimpl->m_linkVel,
                     pimpl->m_invDynLinkProperAccs,
                     pimpl->m_invDynNetExtWrenches,
                     pimpl->m_invDynInternalWrenches,
                     generalizedBiasForces);

    // Convert output base force
    generalizedBiasForces.baseWrench() = pimpl->fromBodyFixedToUsedRepresentation(generalizedBiasForces.baseWrench(),
                                                                           pimpl->m_linkPos(pimpl->m_traversal.getBaseLink()->getIndex()));

    return true;
}